

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint adler32(uchar *data,uint len)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint s1;
  uint uVar5;
  
  uVar4 = 0;
  uVar5 = 1;
  for (; len != 0; len = len - uVar3) {
    uVar2 = 0x15b0;
    uVar3 = 0x15b0;
    if (len < 0x15b0) {
      uVar2 = len;
      uVar3 = len;
    }
    while (uVar2 != 0) {
      bVar1 = *data;
      data = data + 1;
      uVar5 = uVar5 + bVar1;
      uVar4 = uVar4 + uVar5;
      uVar2 = uVar2 - 1;
    }
    uVar5 = uVar5 % 0xfff1;
    uVar4 = uVar4 % 0xfff1;
  }
  return uVar4 << 0x10 | uVar5;
}

Assistant:

static unsigned adler32(const unsigned char* data, unsigned len) {
  return update_adler32(1u, data, len);
}